

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackendOpCodeAttrAsmJs.cpp
# Opt level: O0

int OpCodeAttrAsmJs::GetOpCodeAttributes(OpCodeAsmJs op)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  uint opIndex;
  OpCodeAsmJs op_local;
  
  uVar3 = (uint)op;
  if (uVar3 < 0x100) {
    if (0xf7 < uVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackendOpCodeAttrAsmJs.cpp"
                         ,0x27,"(opIndex < (sizeof(*__countof_helper(OpcodeAttributesAsmJs)) + 0))",
                         "opIndex < (sizeof(*__countof_helper(OpcodeAttributesAsmJs)) + 0)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    opIndex = *(uint *)(OpcodeAttributesAsmJs + (ulong)uVar3 * 4);
  }
  else {
    uVar4 = Js::operator+(MaxByteSizedOpcodes,1);
    if (0x171 < uVar3 - uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackendOpCodeAttrAsmJs.cpp"
                         ,0x2b,
                         "(opIndex < (sizeof(*__countof_helper(ExtendedOpcodeAttributesAsmJs)) + 0))"
                         ,"opIndex < (sizeof(*__countof_helper(ExtendedOpcodeAttributesAsmJs)) + 0)"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    opIndex = *(uint *)(ExtendedOpcodeAttributesAsmJs + (ulong)(uVar3 - uVar4) * 4);
  }
  return opIndex;
}

Assistant:

static const int GetOpCodeAttributes( Js::OpCodeAsmJs op )
    {
        uint opIndex = (uint)op;
        if (opIndex <= (uint)Js::OpCodeAsmJs::MaxByteSizedOpcodes)
        {
            AnalysisAssert(opIndex < _countof(OpcodeAttributesAsmJs));
            return OpcodeAttributesAsmJs[opIndex];
        }
        opIndex -= ( Js::OpCodeAsmJs::MaxByteSizedOpcodes + 1 );
        AnalysisAssert(opIndex < _countof(ExtendedOpcodeAttributesAsmJs));
        return ExtendedOpcodeAttributesAsmJs[opIndex];
    }